

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O3

bool __thiscall S2Loop::BoundaryApproxIntersects(S2Loop *this,Iterator *it,S2Cell *target)

{
  int i;
  bool bVar1;
  bool bVar2;
  const_reference pvVar3;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar4;
  S2Point *a_xyz;
  S2Point *b_xyz;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  R2Point v1;
  R2Point v0;
  R2Rect bound;
  R2Point local_88;
  R2Rect local_78;
  R2Rect local_50;
  
  local_78.bounds_[0].bounds_.c_[0] = (VType)(it->super_IteratorBase).id_.id_;
  bVar1 = S2CellId::contains((S2CellId *)&local_78,(S2CellId)(target->id_).id_);
  if (!bVar1) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
               ,0x1e5,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_50.bounds_[0].bounds_.c_[1],
               "Check failed: it.id().contains(target.id()) ",0x2c);
    abort();
  }
  bVar1 = false;
  pvVar3 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                     ((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
                      (it->super_IteratorBase).cell_._M_b._M_p,0);
  if ((1 < *(uint *)&pvVar3->field_0x4) &&
     (bVar1 = true, (it->super_IteratorBase).id_.id_ != (target->id_).id_)) {
    uVar7 = *(uint *)&pvVar3->field_0x4 >> 1;
    if (BoundaryApproxIntersects(MutableS2ShapeIndex::Iterator_const&,S2Cell_const&)::kMaxError ==
        '\0') {
      BoundaryApproxIntersects();
    }
    local_78.bounds_[0].bounds_.c_[0] = (target->uv_).bounds_[0].bounds_.c_[0];
    local_78.bounds_[0].bounds_.c_[1] = (target->uv_).bounds_[0].bounds_.c_[1];
    local_78.bounds_[1].bounds_.c_[0] = (target->uv_).bounds_[1].bounds_.c_[0];
    local_78.bounds_[1].bounds_.c_[1] = (target->uv_).bounds_[1].bounds_.c_[1];
    local_88.c_[0] = BoundaryApproxIntersects::kMaxError;
    local_88.c_[1] = BoundaryApproxIntersects::kMaxError;
    R2Rect::Expanded(&local_78,&local_88);
    bVar1 = true;
    uVar5 = 1;
    lVar6 = 0;
    do {
      paVar4 = &pvVar3->field_3;
      if (5 < *(uint *)&pvVar3->field_0x4) {
        paVar4 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(pvVar3->field_3).edges_;
      }
      i = *(int *)((long)paVar4 + lVar6);
      local_78.bounds_[0].bounds_.c_[0] = 0.0;
      local_78.bounds_[0].bounds_.c_[1] = 0.0;
      local_88.c_[0] = 0.0;
      local_88.c_[1] = 0.0;
      a_xyz = vertex(this,i);
      b_xyz = vertex(this,i + 1);
      bVar2 = S2::ClipToPaddedFace
                        (a_xyz,b_xyz,(int)target->face_,BoundaryApproxIntersects::kMaxError,
                         (R2Point *)&local_78,&local_88);
      if ((bVar2) && (bVar2 = S2::IntersectsRect((R2Point *)&local_78,&local_88,&local_50), bVar2))
      {
        return bVar1;
      }
      bVar1 = uVar5 < uVar7;
      lVar6 = lVar6 + 4;
      uVar5 = uVar5 + 1;
    } while ((ulong)(uVar7 + (uVar7 == 0)) << 2 != lVar6);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool S2Loop::BoundaryApproxIntersects(const MutableS2ShapeIndex::Iterator& it,
                                      const S2Cell& target) const {
  S2_DCHECK(it.id().contains(target.id()));
  const S2ClippedShape& a_clipped = it.cell().clipped(0);
  int a_num_edges = a_clipped.num_edges();

  // If there are no edges, there is no intersection.
  if (a_num_edges == 0) return false;

  // We can save some work if "target" is the index cell itself.
  if (it.id() == target.id()) return true;

  // Otherwise check whether any of the edges intersect "target".
  static const double kMaxError = (S2::kFaceClipErrorUVCoord +
                                   S2::kIntersectsRectErrorUVDist);
  R2Rect bound = target.GetBoundUV().Expanded(kMaxError);
  for (int i = 0; i < a_num_edges; ++i) {
    int ai = a_clipped.edge(i);
    R2Point v0, v1;
    if (S2::ClipToPaddedFace(vertex(ai), vertex(ai+1), target.face(),
                             kMaxError, &v0, &v1) &&
        S2::IntersectsRect(v0, v1, bound)) {
      return true;
    }
  }
  return false;
}